

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall CConfigManager::RestoreStrings(CConfigManager *this)

{
  char *in_RDI;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RDI[0x1d8] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x36c] == '\0') {
    str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  }
  if (in_RDI[0x3cd] == '\0') {
    str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  }
  if (in_RDI[0x4f0] == '\0') {
    str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  }
  if (in_RDI[0x551] == '\0') {
    str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  }
  if (in_RDI[0x5b2] == '\0') {
    str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  }
  if (in_RDI[0x61c] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x65c] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x6b0] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0xdc0] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0xe2c] == '\0') {
    str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  }
  if (in_RDI[0x1058] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x11e0] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x12c4] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x12e4] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  if (in_RDI[0x13b0] == '\0') {
    str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  }
  return;
}

Assistant:

void CConfigManager::RestoreStrings()
{
	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc)	// nop
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) if(!m_Values.m_##Name[0] && def[0]) str_copy(m_Values.m_##Name, def, len);
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) if(!m_Values.m_##Name[0] && def[0]) str_utf8_copy_num(m_Values.m_##Name, def, size, len);

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR
}